

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void GA_Elem_maximum_patch64
               (int g_a,int64_t *alo,int64_t *ahi,int g_b,int64_t *blo,int64_t *bhi,int g_c,
               int64_t *clo,int64_t *chi)

{
  Integer IVar1;
  Integer IVar2;
  Integer IVar3;
  Integer *pIVar4;
  long lVar5;
  long lVar6;
  Integer _ga_chi [7];
  Integer _ga_clo [7];
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  
  IVar1 = pnga_ndim((long)g_a);
  IVar2 = pnga_ndim((long)g_b);
  IVar3 = pnga_ndim((long)g_c);
  lVar6 = 0;
  lVar5 = 0;
  if (0 < IVar1) {
    lVar5 = IVar1;
  }
  pIVar4 = _ga_alo + IVar1 + -1;
  for (; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    *pIVar4 = alo[lVar6] + 1;
    pIVar4 = pIVar4 + -1;
  }
  pIVar4 = _ga_ahi + IVar1 + -1;
  for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    *pIVar4 = ahi[lVar6] + 1;
    pIVar4 = pIVar4 + -1;
  }
  lVar6 = 0;
  lVar5 = 0;
  if (0 < IVar2) {
    lVar5 = IVar2;
  }
  pIVar4 = _ga_blo + IVar2 + -1;
  for (; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    *pIVar4 = blo[lVar6] + 1;
    pIVar4 = pIVar4 + -1;
  }
  pIVar4 = _ga_bhi + IVar2 + -1;
  for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    *pIVar4 = bhi[lVar6] + 1;
    pIVar4 = pIVar4 + -1;
  }
  lVar6 = 0;
  lVar5 = 0;
  if (0 < IVar3) {
    lVar5 = IVar3;
  }
  pIVar4 = _ga_clo + IVar3 + -1;
  for (; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    *pIVar4 = clo[lVar6] + 1;
    pIVar4 = pIVar4 + -1;
  }
  pIVar4 = _ga_chi + IVar3 + -1;
  for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    *pIVar4 = chi[lVar6] + 1;
    pIVar4 = pIVar4 + -1;
  }
  pnga_elem_maximum_patch
            ((long)g_a,_ga_alo,_ga_ahi,(long)g_b,_ga_blo,_ga_bhi,(long)g_c,_ga_clo,_ga_chi);
  return;
}

Assistant:

void GA_Elem_maximum_patch64(int g_a, int64_t alo[], int64_t ahi[],
                             int g_b, int64_t blo[], int64_t bhi[],
                             int g_c, int64_t clo[], int64_t chi[])
{
    Integer a = (Integer)g_a;
    Integer b = (Integer)g_b;
    Integer c = (Integer)g_c;
    Integer andim = wnga_ndim(a);
    Integer bndim = wnga_ndim(b);
    Integer cndim = wnga_ndim(c);
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    Integer _ga_clo[MAXDIM], _ga_chi[MAXDIM];
    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);
    COPYINDEX_C2F(clo,_ga_clo, cndim);
    COPYINDEX_C2F(chi,_ga_chi, cndim);
    wnga_elem_maximum_patch(a, _ga_alo, _ga_ahi, b, _ga_blo, _ga_bhi, c, _ga_clo, _ga_chi);
}